

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,ScriptElement *element)

{
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_00654550;
  this->type_ = element->type_;
  ScriptOperator::ScriptOperator(&this->op_code_,&element->op_code_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->binary_data_,
             &(element->binary_data_).data_);
  this->value_ = element->value_;
  return;
}

Assistant:

ScriptElement::ScriptElement(const ScriptElement& element)
    : type_(element.type_),
      op_code_(element.op_code_),
      binary_data_(element.binary_data_),
      value_(element.value_) {
  // do nothing
}